

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ts_message.c
# Opt level: O3

TsStatus_t ts_message_get_at(TsMessageRef_t array,size_t index,TsMessageRef_t_conflict *item)

{
  TsStatus_t TVar1;
  
  TVar1 = TsStatusErrorPreconditionFailed;
  if ((((array != (TsMessageRef_t)0x0) && (array->type == TsTypeArray)) &&
      (TVar1 = TsStatusErrorIndexOutOfRange, index < 0xf)) &&
     (*(TsMessageRef_t_conflict *)(array->name + index * 8 + 0x1c) != (TsMessageRef_t_conflict)0x0))
  {
    *item = *(TsMessageRef_t_conflict *)(array->name + index * 8 + 0x1c);
    TVar1 = TsStatusOk;
  }
  return TVar1;
}

Assistant:

TsStatus_t ts_message_get_at(TsMessageRef_t array, size_t index, TsMessageRef_t *item)
{
	/* check preconditions */
	if (array == NULL || array->type != TsTypeArray) {
		return TsStatusErrorPreconditionFailed;
	}
	if (index >= TS_MESSAGE_MAX_BRANCHES || array->value._xfields[index] == NULL) {
		return TsStatusErrorIndexOutOfRange;
	}

	/* return indexed value */
	*item = array->value._xfields[index];
	return TsStatusOk;
}